

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zhash.c
# Opt level: O0

int zhash_iterator_next_volatile(zhash_iterator_t *zit,void *outkey,void *outvalue)

{
  int iVar1;
  int iVar2;
  zhash_t *pzVar3;
  char *pcVar4;
  size_t sVar5;
  void *this_value;
  void *this_key;
  zhash_t *zh;
  void *outvalue_local;
  void *outkey_local;
  zhash_iterator_t *zit_local;
  
  pzVar3 = zit->czh;
  do {
    if (pzVar3->nentries <= zit->last_entry + 1) {
      return 0;
    }
    zit->last_entry = zit->last_entry + 1;
  } while (pzVar3->entries[zit->last_entry * pzVar3->entrysz] == '\0');
  pcVar4 = pzVar3->entries;
  iVar1 = zit->last_entry;
  iVar2 = pzVar3->entrysz;
  sVar5 = pzVar3->keysz;
  if (outkey != (void *)0x0) {
    *(char **)outkey = pzVar3->entries + (zit->last_entry * pzVar3->entrysz + 1);
  }
  if (outvalue != (void *)0x0) {
    *(char **)outvalue = pcVar4 + (long)(iVar1 * iVar2 + 1) + sVar5;
  }
  return 1;
}

Assistant:

int zhash_iterator_next_volatile(zhash_iterator_t *zit, void *outkey, void *outvalue)
{
    const zhash_t *zh = zit->czh;

    while (1) {
        if (zit->last_entry + 1 >= zh->nentries)
            return 0;

        zit->last_entry++;

        if (zh->entries[zit->last_entry * zh->entrysz]) {
            void *this_key = &zh->entries[zit->last_entry * zh->entrysz + 1];
            void *this_value = &zh->entries[zit->last_entry * zh->entrysz + 1 + zh->keysz];

            if (outkey != NULL)
                *((void**) outkey) = this_key;
            if (outvalue != NULL)
                *((void**) outvalue) = this_value;

            return 1;
        }
    }
}